

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::astc_encode_quints(uint32_t *pOutput,uint8_t *pValues,int *bit_pos,int n)

{
  uint bits_00;
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  int in_ECX;
  long in_RSI;
  uint32_t *in_RDI;
  int T;
  int t;
  int i;
  uint32_t bit_mask;
  int bits [3];
  int quints;
  uint32_t in_stack_ffffffffffffffa0;
  int local_34;
  uint local_2c [11];
  
  local_2c[3] = 0;
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    local_2c[3] = ((int)(uint)*(byte *)(in_RSI + local_34) >> ((byte)in_ECX & 0x1f)) *
                  astc_encode_quints::s_muls[local_34] + local_2c[3];
    local_2c[local_34] = (uint)*(byte *)(in_RSI + local_34) & (1 << ((byte)in_ECX & 0x1f)) - 1U;
  }
  if ((int)local_2c[3] < 0x7d) {
    bits_00 = (uint)(byte)g_astc_quint_encode[(int)local_2c[3]];
    local_2c[4] = in_ECX;
    uVar1 = astc_extract_bits(bits_00,0,2);
    uVar2 = local_2c[0] | uVar1 << ((byte)local_2c[4] & 0x1f) |
            local_2c[1] << ((byte)local_2c[4] + 3 & 0x1f);
    uVar1 = astc_extract_bits(bits_00,3,4);
    uVar3 = uVar2 | uVar1 << ((char)(local_2c[4] << 1) + 3U & 0x1f) |
            local_2c[2] << ((char)(local_2c[4] << 1) + 5U & 0x1f);
    astc_extract_bits(bits_00,5,6);
    astc_set_bits(in_RDI,(int *)CONCAT44(uVar3,uVar2),local_2c[0],in_stack_ffffffffffffffa0);
    return;
  }
  __assert_fail("quints < 125",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0x2e37,"void basist::astc_encode_quints(uint32_t *, const uint8_t *, int &, int)");
}

Assistant:

static inline void astc_encode_quints(uint32_t* pOutput, const uint8_t* pValues, int& bit_pos, int n)
	{
		// First extract the trits and the bits from the 5 input values
		int quints = 0, bits[3];
		const uint32_t bit_mask = (1 << n) - 1;
		for (int i = 0; i < 3; i++)
		{
			static const int s_muls[3] = { 1, 5, 25 };

			const int t = pValues[i] >> n;

			quints += t * s_muls[i];
			bits[i] = pValues[i] & bit_mask;
		}

		// Encode the quints, by inverting the bit manipulations done by the decoder, converting 3 quints into 7-bits.
		// See https://www.khronos.org/registry/DataFormat/specs/1.2/dataformat.1.2.html#astc-integer-sequence-encoding

		assert(quints < 125);
		const int T = g_astc_quint_encode[quints];

		// Now interleave the 7 encoded quint bits with the bits to form the encoded output. See table 95-96.
		astc_set_bits(pOutput, bit_pos, bits[0] | (astc_extract_bits(T, 0, 2) << n) | (bits[1] << (3 + n)) | (astc_extract_bits(T, 3, 4) << (3 + n * 2)) |
			(bits[2] << (5 + n * 2)) | (astc_extract_bits(T, 5, 6) << (5 + n * 3)), 7 + n * 3);
	}